

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O3

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::EmuD3D6::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,EmuD3D6 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  MthdCtxSurf3D *pMVar2;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar3;
  SingleMthdTest *this_01;
  result_type rVar4;
  Test *pTVar5;
  MthdDmaGrobj *pMVar6;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_679;
  Test *local_678;
  Test *local_670;
  Test *local_668;
  Test *local_660;
  Test *local_658;
  Test *local_650;
  Test *local_648;
  Test *local_640;
  Test *local_638;
  Test *local_630;
  MthdCtxSurf3D *local_628;
  MthdDmaGrobj *local_620;
  Test *local_618;
  undefined1 *local_610;
  long local_608;
  undefined1 local_600 [16];
  undefined1 *local_5f0;
  long local_5e8;
  undefined1 local_5e0 [16];
  undefined1 *local_5d0;
  long local_5c8;
  undefined1 local_5c0 [16];
  undefined1 *local_5b0;
  long local_5a8;
  undefined1 local_5a0 [16];
  string local_590;
  undefined1 *local_570;
  long local_568;
  undefined1 local_560 [16];
  undefined1 *local_550;
  long local_548;
  undefined1 local_540 [16];
  string local_530;
  string local_510;
  Test *local_4f0;
  Test *local_4e8;
  Test *local_4e0;
  Test *local_4d8;
  Test *local_4d0;
  Test *local_4c8;
  Test *local_4c0;
  Test *local_4b8;
  Test *local_4b0;
  Test *local_4a8;
  Test *local_4a0;
  Test *local_498;
  Test *local_490;
  MthdDmaGrobj *local_488;
  Test *local_480;
  Test *local_478;
  SingleMthdTest *local_470;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_468;
  undefined1 *local_460;
  long local_458;
  undefined1 local_450 [16];
  undefined1 *local_440;
  long local_438;
  undefined1 local_430 [16];
  undefined1 *local_420;
  long local_418;
  undefined1 local_410 [16];
  undefined1 *local_400;
  long local_3f8;
  undefined1 local_3f0 [16];
  undefined1 *local_3e0;
  long local_3d8;
  undefined1 local_3d0 [16];
  undefined1 *local_3c0;
  long local_3b8;
  undefined1 local_3b0 [16];
  undefined1 *local_3a0;
  long local_398;
  undefined1 local_390 [16];
  undefined1 *local_380;
  long local_378;
  undefined1 local_370 [16];
  undefined1 *local_360;
  long local_358;
  undefined1 local_350 [16];
  undefined1 *local_340;
  long local_338;
  undefined1 local_330 [16];
  undefined1 *local_320;
  long local_318;
  undefined1 local_310 [16];
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0 [16];
  undefined1 *local_2e0;
  long local_2d8;
  undefined1 local_2d0 [16];
  undefined1 *local_2c0;
  long local_2b8;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0;
  long local_298;
  undefined1 local_290 [16];
  undefined1 *local_280;
  long local_278;
  undefined1 local_270 [16];
  undefined1 *local_260;
  long local_258;
  undefined1 local_250 [16];
  undefined1 *local_240;
  long local_238;
  undefined1 local_230 [16];
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  undefined1 *local_200;
  long local_1f8;
  undefined1 local_1f0 [16];
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  undefined1 *local_180;
  long local_178;
  undefined1 local_170 [16];
  undefined1 *local_160;
  long local_158;
  undefined1 local_150 [16];
  SingleMthdTest *local_140;
  Test *local_138;
  Test *local_130;
  Test *local_128;
  MthdDmaGrobj *local_120;
  MthdDmaGrobj *local_118;
  MthdCtxSurf3D *local_110;
  Test *local_108;
  Test *local_100;
  Test *local_f8;
  Test *local_f0;
  Test *local_e8;
  Test *local_e0;
  Test *local_d8;
  Test *local_d0;
  Test *local_c8;
  Test *local_c0;
  Test *local_b8;
  Test *local_b0;
  Test *local_a8;
  Test *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_470 = this_01;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_550 = local_540;
  local_468 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar4);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this_01->name,local_550,local_550 + local_548);
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356aa0;
  local_140 = this_01;
  pTVar5 = (Test *)operator_new(0x25950);
  local_478 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_570 = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_570,local_570 + local_568);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356c90;
  local_138 = pTVar5;
  local_618 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  pTVar5 = local_618;
  local_5d0 = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"pm_trigger","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_5d0,local_5d0 + local_5c8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358ad0;
  local_130 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  local_480 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5f0 = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"dma_notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 1;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_5f0,local_5f0 + local_5e8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357928;
  local_128 = pTVar5;
  local_620 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"dma_tex_a","");
  pMVar6 = local_620;
  MthdDmaGrobj::MthdDmaGrobj
            (local_620,opt,(uint32_t)rVar4,&local_510,2,(this->super_Class).cls,0x184,0,4);
  local_120 = pMVar6;
  pMVar6 = (MthdDmaGrobj *)operator_new(0x25960);
  local_488 = pMVar6;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"dma_tex_b","");
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar6,opt,(uint32_t)rVar4,&local_530,3,(this->super_Class).cls,0x188,1,4);
  local_118 = pMVar6;
  local_628 = (MthdCtxSurf3D *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"ctx_surf3d","");
  pMVar2 = local_628;
  uVar1 = (this->super_Class).cls;
  MthdCtxSurf3D::MthdCtxSurf3D
            (local_628,opt,(uint32_t)rVar4,&local_590,4,uVar1,0x18c,(uint)(uVar1 != 0x55));
  local_110 = pMVar2;
  local_630 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_610 = local_600;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"tex_0_offset","");
  pTVar5 = local_630;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_630,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x308;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 5;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_610,local_610 + local_608);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00366f38;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 1;
  local_108 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25958);
  local_490 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_160 = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"tex_1_offset","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x30c;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 6;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_160,local_160 + local_158);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00366f38;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 2;
  local_100 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25958);
  local_498 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"tex_0_format","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x310;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 7;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_180,local_180 + local_178);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367cc8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 1;
  local_f8 = pTVar5;
  local_638 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"tex_1_format","");
  pTVar5 = local_638;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_638,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x314;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 8;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_1a0,local_1a0 + local_198);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367cc8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 2;
  local_f0 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25958);
  local_4a0 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"tex_0_filter","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x318;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 9;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_1c0,local_1c0 + local_1b8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367dc0;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 1;
  local_e8 = pTVar5;
  local_640 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"tex_1_filter","");
  pTVar5 = local_640;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_640,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x31c;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 10;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_1e0,local_1e0 + local_1d8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367dc0;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 2;
  local_e0 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25958);
  local_4a8 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"combine_0_control_alpha","")
  ;
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 800;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_200,local_200 + local_1f8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003681a0;
  pTVar5[0x1e].rnd._M_x[0x119] = 0;
  local_d8 = pTVar5;
  local_648 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"combine_0_control_color","")
  ;
  pTVar5 = local_648;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_648,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x324;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_220,local_220 + local_218);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003681a0;
  pTVar5[0x1e].rnd._M_x[0x119] = 0x100000000;
  local_d0 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25958);
  local_4b0 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"combine_1_control_alpha","")
  ;
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x32c;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xd;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_240,local_240 + local_238);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003681a0;
  pTVar5[0x1e].rnd._M_x[0x119] = 1;
  local_c8 = pTVar5;
  local_650 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"combine_1_control_color","")
  ;
  pTVar5 = local_650;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_650,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x330;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xe;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_260,local_260 + local_258);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003681a0;
  pTVar5[0x1e].rnd._M_x[0x119] = 0x100000001;
  local_c0 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  local_4b8 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"combine_factor","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x334;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xf;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_280,local_280 + local_278);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00368298;
  local_b8 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  local_4c0 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"blend","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x338;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_2a0,local_2a0 + local_298);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367eb8;
  local_b0 = pTVar5;
  local_658 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"config","");
  pTVar5 = local_658;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_658,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x33c;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_2c0,local_2c0 + local_2b8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367fb0;
  local_a8 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  local_4c8 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"stencil_func","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x340;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x12;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_2e0,local_2e0 + local_2d8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00368390;
  local_a0 = pTVar5;
  local_660 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"stencil_op","");
  pTVar5 = local_660;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_660,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x344;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x13;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_300,local_300 + local_2f8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00368488;
  local_98 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  local_4d0 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"fog_color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x348;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x14;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_320,local_320 + local_318);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367220;
  local_90 = pTVar5;
  local_668 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"tlv_x","");
  pTVar5 = local_668;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_668,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x400;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x15;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_340,local_340 + local_338);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003676f8;
  local_88 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  local_4d8 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"tlv_y","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x16;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_360,local_360 + local_358);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003677f0;
  local_80 = pTVar5;
  local_670 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_380 = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"tlv_z","");
  pTVar5 = local_670;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_670,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x408;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x17;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_380,local_380 + local_378);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003678e8;
  local_78 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  local_4e0 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"tlv_rhw","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x40c;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x18;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_3a0,local_3a0 + local_398);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003679e0;
  local_70 = pTVar5;
  local_678 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"tlv_color","");
  pTVar5 = local_678;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_678,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x410;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x19;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_3c0,local_3c0 + local_3b8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367600;
  local_68 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  local_4e8 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"tlv_fog_col1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x414;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x1a;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_3e0,local_3e0 + local_3d8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003680a8;
  local_60 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25960);
  local_4f0 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"tlv_u_0","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x418;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x1b;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_400,local_400 + local_3f8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367ad8;
  pTVar5[0x1e].rnd._M_x[0x119] = 0;
  *(undefined1 *)(pTVar5[0x1e].rnd._M_x + 0x11a) = 0;
  local_58 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25960);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_420 = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"tlv_v_0","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x41c;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x1c;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_420,local_420 + local_418);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367ad8;
  pTVar5[0x1e].rnd._M_x[0x119] = 1;
  *(undefined1 *)(pTVar5[0x1e].rnd._M_x + 0x11a) = 0;
  local_50 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25960);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_440 = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"tlv_u_1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x420;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x1d;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_440,local_440 + local_438);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367ad8;
  pTVar5[0x1e].rnd._M_x[0x119] = 0x100000000;
  *(undefined1 *)(pTVar5[0x1e].rnd._M_x + 0x11a) = 0;
  local_48 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25960);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_460 = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"tlv_v_1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x424;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x28;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x1e;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_460,local_460 + local_458);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00367ad8;
  pTVar5[0x1e].rnd._M_x[0x119] = 0x100000001;
  *(undefined1 *)(pTVar5[0x1e].rnd._M_x + 0x11a) = 1;
  local_40 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5b0 = local_5a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"draw","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x540;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 0x30;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x1f;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_5b0,local_5b0 + local_5a8);
  pvVar3 = local_468;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035b0e8;
  __l._M_len = 0x22;
  __l._M_array = &local_140;
  local_38 = pTVar5;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_468,__l,&local_679);
  if (local_5b0 != local_5a0) {
    operator_delete(local_5b0);
  }
  if (local_460 != local_450) {
    operator_delete(local_460);
  }
  if (local_440 != local_430) {
    operator_delete(local_440);
  }
  if (local_420 != local_410) {
    operator_delete(local_420);
  }
  if (local_400 != local_3f0) {
    operator_delete(local_400);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  if (local_360 != local_350) {
    operator_delete(local_360);
  }
  if (local_340 != local_330) {
    operator_delete(local_340);
  }
  if (local_320 != local_310) {
    operator_delete(local_320);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  if (local_280 != local_270) {
    operator_delete(local_280);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  if (local_610 != local_600) {
    operator_delete(local_610);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p);
  }
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0);
  }
  if (local_5d0 != local_5c0) {
    operator_delete(local_5d0);
  }
  if (local_570 != local_560) {
    operator_delete(local_570);
  }
  if (local_550 != local_540) {
    operator_delete(local_550);
  }
  return pvVar3;
}

Assistant:

std::vector<SingleMthdTest *> EmuD3D6::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", 2, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", 3, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", 4, cls, 0x18c, cls == 0x55 ? SURF2D_NV4 : SURF2D_NV10),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_0_offset", 5, cls, 0x308, 1),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_1_offset", 6, cls, 0x30c, 2),
		new MthdEmuD3D56TexFormat(opt, rnd(), "tex_0_format", 7, cls, 0x310, 1),
		new MthdEmuD3D56TexFormat(opt, rnd(), "tex_1_format", 8, cls, 0x314, 2),
		new MthdEmuD3D56TexFilter(opt, rnd(), "tex_0_filter", 9, cls, 0x318, 1),
		new MthdEmuD3D56TexFilter(opt, rnd(), "tex_1_filter", 10, cls, 0x31c, 2),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_0_control_alpha", 11, cls, 0x320, 0, 0),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_0_control_color", 12, cls, 0x324, 0, 1),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_1_control_alpha", 13, cls, 0x32c, 1, 0),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_1_control_color", 14, cls, 0x330, 1, 1),
		new MthdEmuD3D6CombineFactor(opt, rnd(), "combine_factor", 15, cls, 0x334),
		new MthdEmuD3D56Blend(opt, rnd(), "blend", 16, cls, 0x338),
		new MthdEmuD3D56Config(opt, rnd(), "config", 17, cls, 0x33c),
		new MthdEmuD3D6StencilFunc(opt, rnd(), "stencil_func", 18, cls, 0x340),
		new MthdEmuD3D6StencilOp(opt, rnd(), "stencil_op", 19, cls, 0x344),
		new MthdEmuD3D56FogColor(opt, rnd(), "fog_color", 20, cls, 0x348),
		new MthdEmuD3D56TlvX(opt, rnd(), "tlv_x", 21, cls, 0x400, 8, 0x28),
		new MthdEmuD3D56TlvY(opt, rnd(), "tlv_y", 22, cls, 0x404, 8, 0x28),
		new MthdEmuD3D56TlvZ(opt, rnd(), "tlv_z", 23, cls, 0x408, 8, 0x28),
		new MthdEmuD3D56TlvW(opt, rnd(), "tlv_rhw", 24, cls, 0x40c, 8, 0x28),
		new MthdEmuD3D56TlvColor(opt, rnd(), "tlv_color", 25, cls, 0x410, 8, 0x28),
		new MthdEmuD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", 26, cls, 0x414, 8, 0x28),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u_0", 27, cls, 0x418, 8, 0x28, 0, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v_0", 28, cls, 0x41c, 8, 0x28, 0, 1, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u_1", 29, cls, 0x420, 8, 0x28, 1, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v_1", 30, cls, 0x424, 8, 0x28, 1, 1, true),
		new UntestedMthd(opt, rnd(), "draw", 31, cls, 0x540, 0x30),
	};
}